

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astcenc_ideal_endpoints_and_weights.cpp
# Opt level: O2

void compute_ideal_colors_and_weights_2_comp
               (image_block *blk,partition_info *pi,endpoints_and_weights *ei,int component1,
               int component2)

{
  undefined8 uVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  ushort uVar5;
  bool bVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  ulong uVar10;
  float fVar11;
  bool bVar12;
  uint8_t (*pauVar13) [216];
  ulong uVar14;
  uint j;
  ulong uVar15;
  long lVar16;
  uint i;
  ulong uVar17;
  image_block *piVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  float fVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  float fVar36;
  float fVar37;
  undefined1 auVar34 [16];
  float fVar38;
  undefined1 auVar35 [16];
  float fVar39;
  undefined1 auVar40 [16];
  float fVar41;
  float fVar42;
  partition_metrics pms [4];
  partition_metrics local_b8 [4];
  
  uVar5 = pi->partition_count;
  (ei->ep).partition_count = (uint)uVar5;
  if (uVar5 == 0) {
    __assert_fail("partition_count > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/astc-encoder/Source/astcenc_ideal_endpoints_and_weights.cpp"
                  ,0xe2,
                  "void compute_ideal_colors_and_weights_2_comp(const image_block &, const partition_info &, endpoints_and_weights &, int, int)"
                 );
  }
  bVar2 = blk->texel_count;
  uVar17 = (ulong)bVar2;
  if (uVar17 != 0) {
    piVar18 = blk;
    if (component2 == 1 && component1 == 0) {
      auVar19._0_4_ = (blk->channel_weight).m[0] + 0.0;
      auVar19._4_4_ = (blk->channel_weight).m[1] + 0.0;
      auVar19._8_4_ = (blk->channel_weight).m[2] + 0.0;
      auVar19._12_4_ = (blk->channel_weight).m[3] + 0.0;
      auVar19 = vhaddps_avx(auVar19,auVar19);
      fVar7 = auVar19._0_4_;
      lVar16 = 0x380;
    }
    else if (component2 == 2 && component1 == 0) {
      auVar19 = vpermilps_avx(*(undefined1 (*) [16])(blk->channel_weight).m,0xe8);
      auVar20._0_4_ = auVar19._0_4_ + 0.0;
      auVar20._4_4_ = auVar19._4_4_ + 0.0;
      auVar20._8_4_ = auVar19._8_4_ + 0.0;
      auVar20._12_4_ = auVar19._12_4_ + 0.0;
      auVar19 = vhaddps_avx(auVar20,auVar20);
      fVar7 = auVar19._0_4_;
      lVar16 = 0x700;
    }
    else {
      if ((component1 != 1) || (component2 != 2)) {
        __assert_fail("component1 == 1 && component2 == 2",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/astc-encoder/Source/astcenc_ideal_endpoints_and_weights.cpp"
                      ,0xfd,
                      "void compute_ideal_colors_and_weights_2_comp(const image_block &, const partition_info &, endpoints_and_weights &, int, int)"
                     );
      }
      auVar19 = vpermilps_avx(*(undefined1 (*) [16])(blk->channel_weight).m,0xe9);
      auVar21._0_4_ = auVar19._0_4_ + 0.0;
      auVar21._4_4_ = auVar19._4_4_ + 0.0;
      auVar21._8_4_ = auVar19._8_4_ + 0.0;
      auVar21._12_4_ = auVar19._12_4_ + 0.0;
      auVar19 = vhaddps_avx(auVar21,auVar21);
      fVar7 = auVar19._0_4_;
      lVar16 = 0x700;
      piVar18 = (image_block *)blk->data_g;
    }
    compute_avgs_and_dirs_2_comp(pi,blk,component1,component2,local_b8);
    auVar23._4_4_ = component1;
    auVar23._0_4_ = component1;
    auVar23._8_4_ = component1;
    auVar23._12_4_ = component1;
    auVar30._4_4_ = component2;
    auVar30._0_4_ = component2;
    auVar30._8_4_ = component2;
    auVar30._12_4_ = component2;
    pauVar13 = pi->texels_of_partition;
    bVar12 = true;
    uVar14 = 0;
    auVar21 = vpmovsxbd_avx(ZEXT416(0x3020100));
    auVar19 = vpcmpeqd_avx(auVar21,auVar30);
    auVar21 = vpcmpeqd_avx(auVar21,auVar23);
    auVar33._8_4_ = 0x3f800000;
    auVar33._0_8_ = 0x3f8000003f800000;
    auVar33._12_4_ = 0x3f800000;
    fVar39 = 0.0;
    do {
      if (uVar14 == uVar5) {
        for (; uVar17 < (bVar2 + 7 & 0xfffffff8); uVar17 = uVar17 + 1) {
          ei->weights[uVar17] = 0.0;
          ei->weight_error_scale[uVar17] = 0.0;
        }
        ei->is_constant_weight_error_scale = bVar12;
        return;
      }
      auVar20 = *(undefined1 (*) [16])local_b8[uVar14].dir.m;
      uVar1 = *(undefined8 *)(local_b8[uVar14].dir.m + 2);
      fVar22 = (float)uVar1;
      auVar24._0_4_ = auVar20._0_4_ + fVar22;
      fVar36 = (float)((ulong)uVar1 >> 0x20);
      auVar24._4_4_ = auVar20._4_4_ + fVar36;
      auVar24._8_4_ = auVar20._8_4_ + fVar22;
      auVar24._12_4_ = auVar20._12_4_ + fVar36;
      auVar23 = vhaddps_avx(auVar24,auVar24);
      if (auVar23._0_4_ < 0.0) {
        auVar20 = vsubps_avx(ZEXT816(0) << 0x20,auVar20);
      }
      auVar25._0_4_ = auVar20._0_4_ * auVar20._0_4_;
      auVar25._4_4_ = auVar20._4_4_ * auVar20._4_4_;
      auVar25._8_4_ = auVar20._8_4_ * auVar20._8_4_;
      auVar25._12_4_ = auVar20._12_4_ * auVar20._12_4_;
      auVar23 = vshufpd_avx(auVar25,auVar25,1);
      auVar26._0_4_ = auVar23._0_4_ + auVar25._0_4_;
      auVar26._4_4_ = auVar23._4_4_ + auVar25._4_4_;
      auVar26._8_4_ = auVar23._8_4_ + auVar25._8_4_;
      auVar26._12_4_ = auVar23._12_4_ + auVar25._12_4_;
      auVar23 = vhaddps_avx(auVar26,auVar26);
      fVar22 = auVar23._0_4_;
      auVar34._4_4_ = fVar22;
      auVar34._0_4_ = fVar22;
      auVar34._8_4_ = fVar22;
      auVar34._12_4_ = fVar22;
      auVar23 = vsqrtps_avx(auVar34);
      auVar20 = vdivps_avx(auVar20,auVar23);
      if ((fVar22 == 0.0) && (!NAN(fVar22))) {
        auVar20 = ZEXT816(0x3f3504f33f3504f3);
      }
      auVar23 = *(undefined1 (*) [16])local_b8[uVar14].avg.m;
      bVar3 = pi->partition_texel_count[uVar14];
      uVar15 = 0;
      auVar30 = SUB6416(ZEXT464(0xd01502f9),0);
      auVar24 = SUB6416(ZEXT464(0x501502f9),0);
      while( true ) {
        fVar22 = auVar20._0_4_;
        fVar36 = auVar20._4_4_;
        fVar37 = auVar20._8_4_;
        fVar38 = auVar20._12_4_;
        if (bVar3 == uVar15) break;
        uVar10 = (ulong)(*pauVar13)[uVar15];
        auVar25 = vinsertps_avx(ZEXT416((uint)piVar18->data_r[uVar10]),
                                ZEXT416(*(uint *)((long)blk->data_r + uVar10 * 4 + lVar16)),0x1c);
        auVar25 = vsubps_avx(auVar25,auVar23);
        auVar27._0_4_ = fVar22 * auVar25._0_4_;
        auVar27._4_4_ = fVar36 * auVar25._4_4_;
        auVar27._8_4_ = fVar37 * auVar25._8_4_;
        auVar27._12_4_ = fVar38 * auVar25._12_4_;
        auVar25 = vshufpd_avx(auVar27,auVar27,1);
        auVar28._0_4_ = auVar27._0_4_ + auVar25._0_4_;
        auVar28._4_4_ = auVar27._4_4_ + auVar25._4_4_;
        auVar28._8_4_ = auVar27._8_4_ + auVar25._8_4_;
        auVar28._12_4_ = auVar27._12_4_ + auVar25._12_4_;
        auVar25 = vhaddps_avx(auVar28,auVar28);
        ei->weights[uVar10] = auVar25._0_4_;
        auVar24 = vminss_avx(auVar25,auVar24);
        auVar30 = vmaxss_avx(auVar25,auVar30);
        uVar15 = uVar15 + 1;
      }
      auVar20 = auVar24;
      if (auVar30._0_4_ <= auVar24._0_4_) {
        auVar20 = ZEXT816(0) << 0x20;
      }
      auVar24 = vcmpss_avx(auVar30,auVar24,6);
      auVar31._8_4_ = 0x33d6bf95;
      auVar31._0_8_ = 0x33d6bf9533d6bf95;
      auVar31._12_4_ = 0x33d6bf95;
      auVar30 = vblendvps_avx(auVar31,auVar30,auVar24);
      fVar41 = auVar20._0_4_;
      fVar42 = auVar30._0_4_;
      fVar9 = fVar42 - fVar41;
      fVar8 = fVar9 * fVar9;
      bVar6 = fVar8 == fVar39;
      fVar11 = fVar8;
      if (uVar14 != 0) {
        fVar11 = fVar39;
      }
      fVar39 = fVar11;
      if (uVar14 != 0) {
        bVar12 = (bool)(bVar6 & bVar12);
      }
      fVar8 = fVar8 * fVar7 * 0.5;
      uVar15 = 0;
      while (bVar3 != uVar15) {
        bVar4 = (*pauVar13)[uVar15];
        auVar20 = ZEXT416((uint)((1.0 / fVar9) * (ei->weights[bVar4] - fVar41)));
        auVar30 = vmaxss_avx(auVar20,(undefined1  [16])0x0);
        auVar20 = vcmpss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar20,1);
        auVar20 = vblendvps_avx(auVar30,auVar33,auVar20);
        uVar15 = uVar15 + 1;
        ei->weights[bVar4] = auVar20._0_4_;
        ei->weight_error_scale[bVar4] = fVar8;
        if (NAN(fVar8)) {
          __assert_fail("!astc::isnan(ei.weight_error_scale[tix])",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/astc-encoder/Source/astcenc_ideal_endpoints_and_weights.cpp"
                        ,0x142,
                        "void compute_ideal_colors_and_weights_2_comp(const image_block &, const partition_info &, endpoints_and_weights &, int, int)"
                       );
        }
      }
      auVar29._0_4_ = auVar23._0_4_ + fVar22 * fVar41;
      auVar29._4_4_ = auVar23._4_4_ + fVar36 * fVar41;
      auVar29._8_4_ = auVar23._8_4_ + fVar37 * fVar41;
      auVar29._12_4_ = auVar23._12_4_ + fVar38 * fVar41;
      auVar32._0_4_ = auVar23._0_4_ + fVar22 * fVar42;
      auVar32._4_4_ = auVar23._4_4_ + fVar36 * fVar42;
      auVar32._8_4_ = auVar23._8_4_ + fVar37 * fVar42;
      auVar32._12_4_ = auVar23._12_4_ + fVar38 * fVar42;
      auVar35._4_4_ = auVar29._0_4_;
      auVar35._0_4_ = auVar29._0_4_;
      auVar35._8_4_ = auVar29._0_4_;
      auVar35._12_4_ = auVar29._0_4_;
      auVar20 = vblendvps_avx(*(undefined1 (*) [16])(blk->data_min).m,auVar35,auVar21);
      auVar40._4_4_ = auVar32._0_4_;
      auVar40._0_4_ = auVar32._0_4_;
      auVar40._8_4_ = auVar32._0_4_;
      auVar40._12_4_ = auVar32._0_4_;
      auVar23 = vblendvps_avx(*(undefined1 (*) [16])(blk->data_max).m,auVar40,auVar21);
      auVar30 = vshufps_avx(auVar29,auVar29,0x55);
      auVar20 = vblendvps_avx(auVar20,auVar30,auVar19);
      *(undefined1 (*) [16])(ei->ep).endpt0[uVar14].m = auVar20;
      auVar20 = vshufps_avx(auVar32,auVar32,0x55);
      auVar20 = vblendvps_avx(auVar23,auVar20,auVar19);
      *(undefined1 (*) [16])(ei->ep).endpt1[uVar14].m = auVar20;
      uVar14 = uVar14 + 1;
      pauVar13 = pauVar13 + 1;
    } while( true );
  }
  __assert_fail("texel_count > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/astc-encoder/Source/astcenc_ideal_endpoints_and_weights.cpp"
                ,0xe5,
                "void compute_ideal_colors_and_weights_2_comp(const image_block &, const partition_info &, endpoints_and_weights &, int, int)"
               );
}

Assistant:

static void compute_ideal_colors_and_weights_2_comp(
	const image_block& blk,
	const partition_info& pi,
	endpoints_and_weights& ei,
	int component1,
	int component2
) {
	unsigned int partition_count = pi.partition_count;
	ei.ep.partition_count = partition_count;
	promise(partition_count > 0);

	unsigned int texel_count = blk.texel_count;
	promise(texel_count > 0);

	partition_metrics pms[BLOCK_MAX_PARTITIONS];

	float error_weight;
	const float* data_vr = nullptr;
	const float* data_vg = nullptr;

	if (component1 == 0 && component2 == 1)
	{
		error_weight = hadd_s(blk.channel_weight.swz<0, 1>()) / 2.0f;

		data_vr = blk.data_r;
		data_vg = blk.data_g;
	}
	else if (component1 == 0 && component2 == 2)
	{
		error_weight = hadd_s(blk.channel_weight.swz<0, 2>()) / 2.0f;

		data_vr = blk.data_r;
		data_vg = blk.data_b;
	}
	else // (component1 == 1 && component2 == 2)
	{
		assert(component1 == 1 && component2 == 2);

		error_weight = hadd_s(blk.channel_weight.swz<1, 2>()) / 2.0f;

		data_vr = blk.data_g;
		data_vg = blk.data_b;
	}

	compute_avgs_and_dirs_2_comp(pi, blk, component1, component2, pms);

	bool is_constant_wes { true };
	float partition0_len_sq { 0.0f };

	vmask4 comp1_mask = vint4::lane_id() == vint4(component1);
	vmask4 comp2_mask = vint4::lane_id() == vint4(component2);

	for (unsigned int i = 0; i < partition_count; i++)
	{
		vfloat4 dir = pms[i].dir;
		if (hadd_s(dir) < 0.0f)
		{
			dir = vfloat4::zero() - dir;
		}

		line2 line { pms[i].avg, normalize_safe(dir, unit2()) };
		float lowparam { 1e10f };
		float highparam { -1e10f };

		unsigned int partition_texel_count = pi.partition_texel_count[i];
		for (unsigned int j = 0; j < partition_texel_count; j++)
		{
			unsigned int tix = pi.texels_of_partition[i][j];
			vfloat4 point = vfloat2(data_vr[tix], data_vg[tix]);
			float param = dot_s(point - line.a, line.b);
			ei.weights[tix] = param;

			lowparam = astc::min(param, lowparam);
			highparam = astc::max(param, highparam);
		}

		// It is possible for a uniform-color partition to produce length=0;
		// this causes NaN issues so set to small value to avoid this problem
		if (highparam <= lowparam)
		{
			lowparam = 0.0f;
			highparam = 1e-7f;
		}

		float length = highparam - lowparam;
		float length_squared = length * length;
		float scale = 1.0f / length;

		if (i == 0)
		{
			partition0_len_sq = length_squared;
		}
		else
		{
			is_constant_wes = is_constant_wes && length_squared == partition0_len_sq;
		}

		for (unsigned int j = 0; j < partition_texel_count; j++)
		{
			unsigned int tix = pi.texels_of_partition[i][j];
			float idx = (ei.weights[tix] - lowparam) * scale;
			idx = astc::clamp1f(idx);

			ei.weights[tix] = idx;
			ei.weight_error_scale[tix] = length_squared * error_weight;
			assert(!astc::isnan(ei.weight_error_scale[tix]));
		}

		vfloat4 lowvalue = line.a + line.b * lowparam;
		vfloat4 highvalue = line.a + line.b * highparam;

		vfloat4 ep0 = select(blk.data_min, vfloat4(lowvalue.lane<0>()), comp1_mask);
		vfloat4 ep1 = select(blk.data_max, vfloat4(highvalue.lane<0>()), comp1_mask);

		ei.ep.endpt0[i] = select(ep0, vfloat4(lowvalue.lane<1>()), comp2_mask);
		ei.ep.endpt1[i] = select(ep1, vfloat4(highvalue.lane<1>()), comp2_mask);
	}

	// Zero initialize any SIMD over-fetch
	unsigned int texel_count_simd = round_up_to_simd_multiple_vla(texel_count);
	for (unsigned int i = texel_count; i < texel_count_simd; i++)
	{
		ei.weights[i] = 0.0f;
		ei.weight_error_scale[i] = 0.0f;
	}

	ei.is_constant_weight_error_scale = is_constant_wes;
}